

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po_test.cc
# Opt level: O1

void __thiscall unregistered_options::test_method(unregistered_options *this)

{
  char **argv;
  options_boost_po *this_00;
  int argc;
  int int_opt;
  option_group_definition arg_group;
  char command_line [31];
  int local_320;
  int local_31c;
  undefined **local_318;
  ulong local_310;
  shared_count sStack_308;
  undefined4 **local_300;
  char **local_2f8;
  undefined4 local_2ec;
  undefined1 *local_2e8;
  long local_2e0;
  undefined1 local_2d8 [16];
  option_group_definition local_2c8;
  string local_290;
  undefined **local_270;
  undefined1 local_268;
  undefined8 *local_260;
  int **local_258;
  undefined4 *local_250;
  int *local_248;
  undefined1 local_240;
  undefined8 local_238;
  shared_count asStack_230 [7];
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  typed_option<int> local_118;
  char local_78 [40];
  undefined **local_50;
  undefined1 local_48;
  undefined8 *local_40;
  char *local_38;
  
  builtin_strncpy(local_78,"exe --int_opt 3 --str_opt test",0x1f);
  argv = convert_to_command_args(local_78,&local_320,0x40);
  local_2f8 = argv;
  this_00 = (options_boost_po *)operator_new(0x2e8);
  VW::config::options_boost_po::options_boost_po(this_00,local_320,argv);
  local_2e8 = local_2d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"group1","");
  local_2c8.m_name._M_dataplus._M_p = (pointer)&local_2c8.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_2c8,local_2e8,local_2e8 + local_2e0);
  local_2c8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_2e8 != local_2d8) {
    operator_delete(local_2e8);
  }
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"int_opt","");
  VW::config::typed_option<int>::typed_option(&local_118,&local_290,&local_31c);
  VW::config::option_group_definition::add<int>(&local_2c8,&local_118);
  local_118.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002eb4f8;
  if (local_118.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_118.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_118.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  (**(this_00->super_options_i)._vptr_options_i)(this_00,&local_2c8);
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_138,0x14f);
  local_318 = (undefined **)CONCAT71(local_318._1_7_,1);
  local_310 = 0;
  sStack_308.pi_ = (sp_counted_base *)0x0;
  local_268 = 0;
  local_270 = &PTR__lazy_ostream_002ebeb0;
  local_260 = &boost::unit_test::lazy_ostream::inst;
  local_258 = (int **)0x289c5e;
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_150 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_308);
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_198,0x150);
  local_48 = 0;
  local_50 = &PTR__lazy_ostream_002eb6f8;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  local_250 = &local_2ec;
  local_2ec = 3;
  local_240 = local_31c == 3;
  local_238 = 0;
  asStack_230[0].pi_ = (sp_counted_base *)0x0;
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_120 = "";
  local_258 = &local_248;
  local_268 = 0;
  local_270 = &PTR__lazy_ostream_002eb830;
  local_260 = &boost::unit_test::lazy_ostream::inst;
  local_300 = &local_250;
  local_310 = local_310 & 0xffffffffffffff00;
  local_318 = &PTR__lazy_ostream_002eb830;
  sStack_308.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_248 = &local_31c;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(asStack_230);
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b8,0x152);
  (*(this_00->super_options_i)._vptr_options_i[7])(this_00);
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d8,0x152);
  local_318 = (undefined **)((ulong)local_318 & 0xffffffffffffff00);
  local_310 = 0;
  sStack_308.pi_ = (sp_counted_base *)0x0;
  local_268 = 0;
  local_270 = &PTR__lazy_ostream_002ec1c8;
  local_260 = &boost::unit_test::lazy_ostream::inst;
  local_258 = (int **)0x289e6d;
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_1f0 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_308);
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_2c8.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.m_name._M_dataplus._M_p != &local_2c8.m_name.field_2) {
    operator_delete(local_2c8.m_name._M_dataplus._M_p);
  }
  (*(this_00->super_options_i)._vptr_options_i[9])(this_00);
  operator_delete(local_2f8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(unregistered_options) {
  int int_opt;

  char command_line[] = "exe --int_opt 3 --str_opt test";
  int argc;
  // Only the returned char* needs to be deleted as the individual pointers simply point into command_line.
  std::unique_ptr<char*> argv(convert_to_command_args(command_line, argc));

  std::unique_ptr<options_i> options = std::unique_ptr<options_boost_po>(
    new options_boost_po(argc, argv.get()));

  option_group_definition arg_group("group1");
  arg_group.add(make_option("int_opt", int_opt));

  BOOST_CHECK_NO_THROW(options->add_and_parse(arg_group));
  BOOST_CHECK_EQUAL(int_opt, 3);

  BOOST_CHECK_THROW(options->check_unregistered(), VW::vw_exception);
}